

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O0

Uint64 __thiscall
Diligent::RenderDeviceVkImpl::ExecuteCommandBuffer
          (RenderDeviceVkImpl *this,SoftwareQueueIndex CommandQueueId,VkSubmitInfo *SubmitInfo,
          vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
          *pSignalFences)

{
  Uint64 local_38;
  Uint64 SubmittedCmdBuffNumber;
  Uint64 SubmittedFenceValue;
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  *pSignalFences_local;
  VkSubmitInfo *SubmitInfo_local;
  RenderDeviceVkImpl *this_local;
  SoftwareQueueIndex CommandQueueId_local;
  
  SubmittedCmdBuffNumber = 0;
  local_38 = 0;
  SubmittedFenceValue = (Uint64)pSignalFences;
  pSignalFences_local =
       (vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
        *)SubmitInfo;
  SubmitInfo_local = (VkSubmitInfo *)this;
  this_local._7_1_ = CommandQueueId.m_Value;
  SubmitCommandBuffer(this,CommandQueueId,SubmitInfo,&local_38,&SubmittedCmdBuffNumber,pSignalFences
                     );
  VulkanUtilities::VulkanMemoryManager::ShrinkMemory(&this->m_MemoryMgr);
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::PurgeReleaseQueue(&this->
                       super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                      ,this_local._7_1_,false);
  return SubmittedCmdBuffNumber;
}

Assistant:

Uint64 RenderDeviceVkImpl::ExecuteCommandBuffer(SoftwareQueueIndex CommandQueueId, const VkSubmitInfo& SubmitInfo, std::vector<std::pair<Uint64, RefCntAutoPtr<FenceVkImpl>>>* pSignalFences)
{
    Uint64 SubmittedFenceValue    = 0;
    Uint64 SubmittedCmdBuffNumber = 0;
    SubmitCommandBuffer(CommandQueueId, SubmitInfo, SubmittedCmdBuffNumber, SubmittedFenceValue, pSignalFences);

    m_MemoryMgr.ShrinkMemory();
    PurgeReleaseQueue(CommandQueueId);

    return SubmittedFenceValue;
}